

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void * parallel_iterator_thread(void *args)

{
  void *pvVar1;
  fdb_status fVar2;
  int iVar3;
  fdb_status fVar4;
  ulong uVar5;
  fdb_doc *pfVar6;
  fdb_doc *doc;
  fdb_iterator *fit2;
  fdb_kvs_handle *snap_db;
  fdb_iterator *fit;
  fdb_kvs_handle *db;
  fdb_seqnum_t snap_seqnum;
  fdb_file_handle *dbfile;
  char key [16];
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  fdb_get_default_kvs_config();
  uVar5 = 0;
  do {
    do {
      if (*(int *)((long)args + 8) <= (int)uVar5) {
        pthread_exit((void *)0x0);
      }
      fVar2 = fdb_open(&dbfile,*(char **)((long)args + 0x10),*args);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe3d);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe3d,"void *parallel_iterator_thread(void *)");
      }
      fVar2 = fdb_kvs_open_default(dbfile,&db,&kvs_config);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe3f);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe3f,"void *parallel_iterator_thread(void *)");
      }
      std::mutex::lock((mutex *)&((pthread_mutex_t *)((long)args + 0x18))->__data);
      fVar2 = fdb_snapshot_open(db,&snap_db,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe44);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe44,"void *parallel_iterator_thread(void *)");
      }
      pthread_mutex_unlock((pthread_mutex_t *)((long)args + 0x18));
      fdb_get_kvs_seqnum(snap_db,&snap_seqnum);
      fVar2 = fdb_iterator_init(snap_db,&fit,(void *)0x0,0,(void *)0x0,0,0);
      fdb_iterator_sequence_init(snap_db,&fit2,0,0,0);
    } while (fVar2 == FDB_RESULT_ITERATOR_FAIL);
    uVar5 = 0;
    while (fVar2 == FDB_RESULT_SUCCESS) {
      doc = (fdb_doc *)0x0;
      fVar2 = fdb_iterator_get(fit,&doc);
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      sprintf(key,"key%05d",uVar5 & 0xffffffff);
      pfVar6 = doc;
      pvVar1 = doc->key;
      iVar3 = bcmp(pvVar1,key,doc->keylen);
      if (iVar3 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",key,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe57);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe57,"void *parallel_iterator_thread(void *)");
      }
      uVar5 = uVar5 + 1;
      if ((uVar5 != pfVar6->seqnum) &&
         (fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                 ), pfVar6 = doc, uVar5 != doc->seqnum)) {
        __assert_fail("doc->seqnum == (fdb_seqnum_t)i+1",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe58,"void *parallel_iterator_thread(void *)");
      }
      fdb_doc_free(pfVar6);
      doc = (fdb_doc *)0x0;
      fVar2 = fdb_iterator_get(fit2,&doc);
      pfVar6 = doc;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe5e);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe5e,"void *parallel_iterator_thread(void *)");
      }
      pvVar1 = doc->key;
      iVar3 = bcmp(pvVar1,key,doc->keylen);
      if (iVar3 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",key,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe5f);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe5f,"void *parallel_iterator_thread(void *)");
      }
      if ((uVar5 != pfVar6->seqnum) &&
         (fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                 ), pfVar6 = doc, uVar5 != doc->seqnum)) {
        __assert_fail("doc->seqnum == (fdb_seqnum_t)i+1",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe60,"void *parallel_iterator_thread(void *)");
      }
      fdb_doc_free(pfVar6);
      fVar2 = fdb_iterator_next(fit);
      fVar4 = fdb_iterator_next(fit2);
      if (fVar2 != fVar4) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
               );
        fVar4 = fdb_iterator_next(fit2);
        if (fVar2 != fVar4) {
          __assert_fail("status == fdb_iterator_next(fit2)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xe65,"void *parallel_iterator_thread(void *)");
        }
      }
    }
    if ((snap_seqnum != (uVar5 & 0xffffffff)) &&
       (fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
               ), snap_seqnum != (uVar5 & 0xffffffff))) {
      __assert_fail("(fdb_seqnum_t)i == snap_seqnum",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xe67,"void *parallel_iterator_thread(void *)");
    }
    fVar2 = fdb_iterator_close(fit);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xe6b);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xe6b,"void *parallel_iterator_thread(void *)");
    }
    fVar2 = fdb_iterator_close(fit2);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xe6d);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xe6d,"void *parallel_iterator_thread(void *)");
    }
    fVar2 = fdb_kvs_close(snap_db);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xe6f);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xe6f,"void *parallel_iterator_thread(void *)");
    }
    fVar2 = fdb_kvs_close(db);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xe71);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xe71,"void *parallel_iterator_thread(void *)");
    }
    fVar2 = fdb_close(dbfile);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xe73);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xe73,"void *parallel_iterator_thread(void *)");
    }
  } while( true );
}

Assistant:

void *parallel_iterator_thread(void *args)
{
    TEST_INIT();

    struct piterator_ctx *ctx = (struct piterator_ctx *)args;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_iterator *fit, *fit2;
    fdb_status status;
    fdb_seqnum_t snap_seqnum;
    int num_read = 0;
    fdb_doc *doc;
    char key[16];

    while (num_read < ctx->num_docs) {
        status = fdb_open(&dbfile, ctx->filename, ctx->config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        ctx->lock.lock();
        // Open in-memory snapshot
        status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        ctx->lock.unlock();

        fdb_get_kvs_seqnum(snap_db, &snap_seqnum);
        // Iterate the in-memory snapshot
        status = fdb_iterator_init(snap_db, &fit, 0, 0, 0, 0, FDB_ITR_NONE);
        fdb_iterator_sequence_init(snap_db, &fit2, 0, 0, FDB_ITR_NONE);

        if (status == FDB_RESULT_ITERATOR_FAIL) {
            continue;
        }
        int i = 0;
        while (status == FDB_RESULT_SUCCESS) {
            doc = NULL;
            status = fdb_iterator_get(fit, &doc);
            if (status != FDB_RESULT_SUCCESS) {
                break;
            }
            sprintf(key, "key%05d", i);
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CHK(doc->seqnum == (fdb_seqnum_t)i+1);
            // printf("Got %s seqnum %llu\n", key, doc->seqnum);
            fdb_doc_free(doc);
            doc = NULL;

            status = fdb_iterator_get(fit2, &doc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CHK(doc->seqnum == (fdb_seqnum_t)i+1);
            fdb_doc_free(doc);

            i++;
            status = fdb_iterator_next(fit);
            TEST_CHK(status == fdb_iterator_next(fit2));
        }
        TEST_CHK((fdb_seqnum_t)i == snap_seqnum);
        num_read = snap_seqnum;

        status = fdb_iterator_close(fit);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_iterator_close(fit2);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_close(snap_db);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_close(db);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // shutdown
    thread_exit(0);
    return NULL;
}